

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O2

double __thiscall CppMLNN::loss(CppMLNN *this,MatrixXd *y_predict,MatrixXd *labels)

{
  Scalar SVar1;
  MatrixXd entropy;
  MatrixXd probs;
  MatrixXd local_58;
  MatrixXd local_40;
  DenseStorage<double,__1,__1,__1,_0> local_28;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_28,(DenseStorage<double,__1,__1,__1,_0> *)y_predict);
  softmax(&local_40,(CppMLNN *)y_predict,(MatrixXd *)&local_28);
  free(local_28.m_data);
  cross_entropy(&local_58,(CppMLNN *)y_predict,&local_40,labels);
  SVar1 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::mean
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_58);
  free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return SVar1;
}

Assistant:

double CppMLNN::loss(const MatrixXd &y_predict, const MatrixXd &labels) {
	MatrixXd probs = softmax(y_predict);
	MatrixXd entropy = cross_entropy(probs, labels);

	return entropy.mean();
}